

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

int __thiscall ImFontAtlas::AddCustomRectRegular(ImFontAtlas *this,int width,int height)

{
  ImFontAtlasCustomRect *pIVar1;
  int iVar2;
  ImFontAtlasCustomRect *__dest;
  int iVar3;
  int iVar4;
  
  if (0xfffe < width - 1U) {
    __assert_fail("width > 0 && width <= 0xFFFF",
                  "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_draw.cpp"
                  ,0x7b2,"int ImFontAtlas::AddCustomRectRegular(int, int)");
  }
  if (height - 1U < 0xffff) {
    iVar2 = (this->CustomRects).Size;
    if (iVar2 == (this->CustomRects).Capacity) {
      if (iVar2 == 0) {
        iVar3 = 8;
      }
      else {
        iVar3 = iVar2 / 2 + iVar2;
      }
      iVar4 = iVar2 + 1;
      if (iVar2 + 1 < iVar3) {
        iVar4 = iVar3;
      }
      __dest = (ImFontAtlasCustomRect *)ImGui::MemAlloc((long)iVar4 << 5);
      pIVar1 = (this->CustomRects).Data;
      if (pIVar1 != (ImFontAtlasCustomRect *)0x0) {
        memcpy(__dest,pIVar1,(long)(this->CustomRects).Size << 5);
        ImGui::MemFree((this->CustomRects).Data);
      }
      (this->CustomRects).Data = __dest;
      (this->CustomRects).Capacity = iVar4;
      iVar2 = (this->CustomRects).Size;
    }
    else {
      __dest = (this->CustomRects).Data;
    }
    __dest[iVar2].Width = (unsigned_short)width;
    __dest[iVar2].Height = (unsigned_short)height;
    __dest[iVar2].X = 0xffff;
    __dest[iVar2].Y = 0xffff;
    pIVar1 = __dest + iVar2;
    pIVar1->GlyphID = 0;
    pIVar1->GlyphAdvanceX = 0.0;
    ((ImVec2 *)(&pIVar1->GlyphID + 2))->x = 0.0;
    ((ImVec2 *)(&pIVar1->GlyphID + 2))->y = 0.0;
    __dest[iVar2].Font = (ImFont *)0x0;
    iVar2 = (this->CustomRects).Size;
    (this->CustomRects).Size = iVar2 + 1;
    return iVar2;
  }
  __assert_fail("height > 0 && height <= 0xFFFF",
                "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_draw.cpp"
                ,0x7b3,"int ImFontAtlas::AddCustomRectRegular(int, int)");
}

Assistant:

int ImFontAtlas::AddCustomRectRegular(int width, int height)
{
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    ImFontAtlasCustomRect r;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}